

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall pg::Game::write_pgsolver(Game *this,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  int *local_28;
  int *curedge;
  bool first;
  int i;
  ostream *os_local;
  Game *this_local;
  
  poVar3 = std::operator<<(os,"parity ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->n_vertices);
  poVar3 = std::operator<<(poVar3,";");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (curedge._4_4_ = 0; (long)curedge._4_4_ < this->n_vertices; curedge._4_4_ = curedge._4_4_ + 1)
  {
    poVar3 = (ostream *)std::ostream::operator<<(os,curedge._4_4_);
    poVar3 = std::operator<<(poVar3," ");
    iVar2 = priority(this,curedge._4_4_);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," ");
    iVar2 = owner(this,curedge._4_4_);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3," ");
    bVar1 = true;
    for (local_28 = outs(this,curedge._4_4_); *local_28 != -1; local_28 = local_28 + 1) {
      if (bVar1) {
        bVar1 = false;
      }
      else {
        std::operator<<(os,",");
      }
      std::ostream::operator<<(os,*local_28);
    }
    if (this->_label[curedge._4_4_] != (string *)0x0) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        poVar3 = std::operator<<(os," \"");
        poVar3 = std::operator<<(poVar3,(string *)this->_label[curedge._4_4_]);
        std::operator<<(poVar3,"\"");
      }
    }
    poVar3 = std::operator<<(os,";");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void
Game::write_pgsolver(std::ostream &os)
{
    // print banner
    os << "parity " << n_vertices << ";" << std::endl;

    // print vertices
    for (int i=0; i<n_vertices; i++) {
        os << i << " " << priority(i) << " " << owner(i) << " ";
        bool first = true;
        for (auto curedge = outs(i); *curedge != -1; curedge++) {
            if (first) first = false;
            else os << ",";
            os << *curedge;
        }
        if (_label[i] != 0 and !_label[i]->empty()) os << " \"" << *_label[i] << "\"";
        os << ";" << std::endl;
    }
}